

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat_room.cpp
# Opt level: O3

void __thiscall ChatRoom::message(ChatRoom *this,string *origin,string *dest,string *message)

{
  shared_ptr<Person> *psVar1;
  bool bVar2;
  ulong uVar3;
  __normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
  _Var4;
  shared_ptr<Person> *psVar5;
  __normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
  __it;
  long lVar6;
  
  __it._M_current =
       (this->m_people).
       super__Vector_base<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_people).
           super__Vector_base<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)psVar1 - (long)__it._M_current;
  if (0 < (long)uVar3 >> 6) {
    psVar5 = (shared_ptr<Person> *)
             ((long)&((__it._M_current)->super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr + (uVar3 & 0xffffffffffffffc0));
    lVar6 = ((long)uVar3 >> 6) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)dest,__it);
      _Var4._M_current = __it._M_current;
      if (bVar2) goto LAB_001026ce;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)dest,__it._M_current + 1);
      _Var4._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_001026ce;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)dest,__it._M_current + 2);
      _Var4._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_001026ce;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)dest,__it._M_current + 3);
      _Var4._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_001026ce;
      __it._M_current = __it._M_current + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
    uVar3 = (long)psVar1 - (long)psVar5;
    __it._M_current = psVar5;
  }
  lVar6 = (long)uVar3 >> 4;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      if (lVar6 != 3) {
        return;
      }
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)dest,__it);
      _Var4._M_current = __it._M_current;
      if (bVar2) goto LAB_001026ce;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                          *)dest,__it);
    _Var4._M_current = __it._M_current;
    if (bVar2) goto LAB_001026ce;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
          ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                        *)dest,__it);
  _Var4._M_current = __it._M_current;
  if (!bVar2) {
    _Var4._M_current = psVar1;
  }
LAB_001026ce:
  if (_Var4._M_current == psVar1) {
    return;
  }
  Person::recieve(((_Var4._M_current)->super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr,origin,message);
  return;
}

Assistant:

void ChatRoom::message(const std::string& origin, const std::string& dest, const std::string& message)
{
	auto it{std::find_if(m_people.begin(), m_people.end(), [&dest] (const auto& p)
			{
				return p->m_name == dest;
			})};

	if(it != m_people.end())
	{
		(*it)->recieve(origin, message);
	};
}